

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O3

bool __thiscall IR::Opnd::IsWriteBarrierTriggerableValue(Opnd *this)

{
  bool bVar1;
  undefined8 in_RAX;
  ValueType local_18;
  undefined1 local_16 [2];
  ValueType local_14;
  ValueType local_12;
  
  _local_18 = CONCAT62((int6)((ulong)in_RAX >> 0x10),(this->m_valueType).field_0.bits);
  bVar1 = ValueType::IsNumber(&local_18);
  if ((!bVar1) && (TySize[this->m_type] == 8)) {
    if ((DAT_015bf41e == '\x01') && (DAT_015bf41f != '\0')) {
      return true;
    }
    if ((this->m_kind != OpndKindAddr) ||
       (*(byte *)((long)&this[2].m_valueType.field_0.bits + 1) != 10)) {
      _local_18 = CONCAT22((this->m_valueType).field_0.bits,local_18.field_0);
      bVar1 = ValueType::IsBoolean((ValueType *)local_16);
      if (!bVar1) {
        _local_18 = CONCAT24((this->m_valueType).field_0.bits,_local_18);
        bVar1 = ValueType::IsNull(&local_14);
        if (!bVar1) {
          _local_18 = CONCAT26((this->m_valueType).field_0.bits,_local_18);
          bVar1 = ValueType::IsUndefined(&local_12);
          return !bVar1;
        }
      }
    }
  }
  return false;
}

Assistant:

bool
Opnd::IsWriteBarrierTriggerableValue()
{
    // Determines whether if an operand is used as a source in a store instruction, whether the store needs a write barrier

    // If it's a tagged value, we don't need a write barrier
    if (this->IsTaggedValue())
    {
        return false;
    }

    if (TySize[this->GetType()] != sizeof(void*))
    {
        return false;
    }

#if DBG
    if (CONFIG_FLAG(ForceSoftwareWriteBarrier) && CONFIG_FLAG(VerifyBarrierBit))
    {
        return true; // No further optimization if we are in verification
    }
#endif

    // If this operand is known address, then it doesn't need a write barrier, the address is either not a GC address or is pinned
    if (this->IsAddrOpnd() && this->AsAddrOpnd()->GetAddrOpndKind() == AddrOpndKindDynamicVar)
    {
        return false;
    }

    // If its null/boolean/undefined, we don't need a write barrier since the javascript library will keep those guys alive
    return !(this->GetValueType().IsBoolean() || this->GetValueType().IsNull() || this->GetValueType().IsUndefined());
}